

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O2

int WebPRescalerImport(WebPRescaler *rescaler,int num_lines,uint8_t *src,int src_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int x;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  
  iVar5 = 0;
  if (num_lines < 1) {
    num_lines = iVar5;
  }
  while ((iVar4 = num_lines, iVar5 != num_lines &&
         ((rescaler->dst_height <= rescaler->dst_y || (iVar4 = iVar5, 0 < rescaler->y_accum))))) {
    if (rescaler->y_expand != 0) {
      uVar1 = rescaler->irow;
      uVar2 = rescaler->frow;
      auVar6._8_4_ = (int)uVar1;
      auVar6._0_8_ = uVar2;
      auVar6._12_4_ = (int)((ulong)uVar1 >> 0x20);
      rescaler->irow = (rescaler_t *)uVar2;
      rescaler->frow = (rescaler_t *)auVar6._8_8_;
    }
    WebPRescalerImportRow(rescaler,src);
    if (rescaler->y_expand == 0) {
      for (lVar3 = 0; lVar3 < (long)rescaler->dst_width * (long)rescaler->num_channels;
          lVar3 = lVar3 + 1) {
        rescaler->irow[lVar3] = rescaler->irow[lVar3] + rescaler->frow[lVar3];
      }
    }
    rescaler->src_y = rescaler->src_y + 1;
    src = src + src_stride;
    iVar5 = iVar5 + 1;
    rescaler->y_accum = rescaler->y_accum - rescaler->y_sub;
  }
  return iVar4;
}

Assistant:

int WebPRescalerImport(WebPRescaler* const rescaler, int num_lines,
                       const uint8_t* src, int src_stride) {
  int total_imported = 0;
  while (total_imported < num_lines &&
         !WebPRescalerHasPendingOutput(rescaler)) {
    if (rescaler->y_expand) {
      rescaler_t* const tmp = rescaler->irow;
      rescaler->irow = rescaler->frow;
      rescaler->frow = tmp;
    }
    WebPRescalerImportRow(rescaler, src);
    if (!rescaler->y_expand) {    // Accumulate the contribution of the new row.
      int x;
      for (x = 0; x < rescaler->num_channels * rescaler->dst_width; ++x) {
        rescaler->irow[x] += rescaler->frow[x];
      }
    }
    ++rescaler->src_y;
    src += src_stride;
    ++total_imported;
    rescaler->y_accum -= rescaler->y_sub;
  }
  return total_imported;
}